

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_camera.c
# Opt level: O3

void add_vertex(double x,double y,double z,double u,double v,ALLEGRO_COLOR color)

{
  ALLEGRO_VERTEX *pAVar1;
  ALLEGRO_COLOR *pAVar2;
  bool bVar3;
  ALLEGRO_VERTEX *pAVar4;
  int iVar5;
  long lVar6;
  
  lVar6 = (long)ex.n;
  iVar5 = ex.n + 1;
  bVar3 = ex.v_size <= ex.n;
  ex.n = iVar5;
  if (bVar3) {
    ex.v_size = ex.v_size * 2 + 2;
    ex.v = (ALLEGRO_VERTEX *)realloc(ex.v,(long)ex.v_size * 0x24);
  }
  pAVar4 = ex.v;
  pAVar1 = ex.v + lVar6;
  pAVar1->x = (float)x;
  pAVar1->y = (float)y;
  pAVar1->z = (float)z;
  pAVar1->u = (float)u;
  pAVar4[lVar6].v = (float)v;
  pAVar2 = &pAVar4[lVar6].color;
  pAVar2->r = color.r;
  pAVar2->g = color.g;
  pAVar2->b = color.b;
  pAVar2->a = color.a;
  return;
}

Assistant:

static void add_vertex(double x, double y, double z, double u, double v,
      ALLEGRO_COLOR color)
{
   int i = ex.n++;
   if (i >= ex.v_size) {
      ex.v_size += 1;
      ex.v_size *= 2;
      ex.v = realloc(ex.v, ex.v_size * sizeof *ex.v);
   }
   ex.v[i].x = x;
   ex.v[i].y = y;
   ex.v[i].z = z;
   ex.v[i].u = u;
   ex.v[i].v = v;
   ex.v[i].color = color;
}